

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup_table.h
# Opt level: O0

void __thiscall
charls::golomb_code_table::add_entry(golomb_code_table *this,uint8_t value,golomb_code c)

{
  char cVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  unsigned_long uVar4;
  reference pvVar5;
  ulong local_28;
  size_t i;
  uint32_t length;
  uint8_t value_local;
  golomb_code_table *this_local;
  golomb_code c_local;
  
  this_local = (golomb_code_table *)c;
  uVar2 = golomb_code::length((golomb_code *)&this_local);
  if (8 < uVar2) {
    __assert_fail("static_cast<size_t>(length) <= byte_bit_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/lookup_table.h"
                  ,0x2f,
                  "void charls::golomb_code_table::add_entry(const uint8_t, const golomb_code)");
  }
  local_28 = 0;
  while( true ) {
    uVar4 = conditional_static_cast<unsigned_long,_unsigned_int,_0>(1);
    cVar1 = (char)uVar2;
    if (uVar4 << (8U - cVar1 & 0x3f) <= local_28) {
      return;
    }
    pvVar5 = std::array<charls::golomb_code,_256UL>::operator[]
                       (&this->types_,((ulong)value << (8U - cVar1 & 0x3f)) + local_28);
    uVar3 = golomb_code::length(pvVar5);
    if (uVar3 != 0) break;
    pvVar5 = std::array<charls::golomb_code,_256UL>::operator[]
                       (&this->types_,((ulong)value << (8U - cVar1 & 0x3f)) + local_28);
    *pvVar5 = (value_type)this_local;
    local_28 = local_28 + 1;
  }
  __assert_fail("types_[(static_cast<size_t>(value) << (byte_bit_count - length)) + i].length() == 0"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/lookup_table.h"
                ,0x33,"void charls::golomb_code_table::add_entry(const uint8_t, const golomb_code)")
  ;
}

Assistant:

void add_entry(const uint8_t value, const golomb_code c) noexcept
    {
        const uint32_t length{c.length()};
        ASSERT(static_cast<size_t>(length) <= byte_bit_count);

        for (size_t i{}; i < conditional_static_cast<size_t>(1U) << (byte_bit_count - length); ++i)
        {
            ASSERT(types_[(static_cast<size_t>(value) << (byte_bit_count - length)) + i].length() == 0);
            types_[(static_cast<size_t>(value) << (byte_bit_count - length)) + i] = c;
        }
    }